

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void google::protobuf::descriptor_unittest::anon_unknown_532::FillValidMapEntry
               (FileDescriptorProto *file_proto)

{
  bool bVar1;
  char *message;
  Message *in_RCX;
  char *in_R9;
  string_view input;
  string local_78;
  AssertHelper local_58 [3];
  Message local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto *file_proto_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )file_proto;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,
             "name: \'foo.proto\' message_type {   name: \'Foo\'   field {     name: \'foo_map\' number: 1 label:LABEL_REPEATED     type_name: \'FooMapEntry\'   }   nested_type {     name: \'FooMapEntry\'     options {  map_entry: true }     field {       name: \'key\' number: 1 type:TYPE_INT32 label:LABEL_OPTIONAL     }     field {       name: \'value\' number: 2 type:TYPE_INT32 label:LABEL_OPTIONAL     }   } } message_type {   name: \'Bar\'   extension_range { start: 1 end: 10 }} "
            );
  input._M_str = (char *)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
  input._M_len = (size_t)local_38._M_str;
  local_21 = TextFormat::ParseFromString((TextFormat *)local_38._M_len,input,in_RCX);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_20,
               (AssertionResult *)
               "TextFormat::ParseFromString( \"name: \'foo.proto\' \" \"message_type { \" \"  name: \'Foo\' \" \"  field { \" \"    name: \'foo_map\' number: 1 label:LABEL_REPEATED \" \"    type_name: \'FooMapEntry\' \" \"  } \" \"  nested_type { \" \"    name: \'FooMapEntry\' \" \"    options {  map_entry: true } \" \"    field { \" \"      name: \'key\' number: 1 type:TYPE_INT32 label:LABEL_OPTIONAL \" \"    } \" \"    field { \" \"      name: \'value\' number: 2 type:TYPE_INT32 label:LABEL_OPTIONAL \" \"    } \" \"  } \" \"} \" \"message_type { \" \"  name: \'Bar\' \" \"  extension_range { start: 1 end: 10 }\" \"} \", file_proto)"
               ,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1bf5,message);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

void FillValidMapEntry(FileDescriptorProto* file_proto) {
  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: 'foo.proto' "
      "message_type { "
      "  name: 'Foo' "
      "  field { "
      "    name: 'foo_map' number: 1 label:LABEL_REPEATED "
      "    type_name: 'FooMapEntry' "
      "  } "
      "  nested_type { "
      "    name: 'FooMapEntry' "
      "    options {  map_entry: true } "
      "    field { "
      "      name: 'key' number: 1 type:TYPE_INT32 label:LABEL_OPTIONAL "
      "    } "
      "    field { "
      "      name: 'value' number: 2 type:TYPE_INT32 label:LABEL_OPTIONAL "
      "    } "
      "  } "
      "} "
      "message_type { "
      "  name: 'Bar' "
      "  extension_range { start: 1 end: 10 }"
      "} ",
      file_proto));
}